

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O2

bool TestEncoders(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  uint8_t uVar1;
  byte bVar2;
  int32_t iVar3;
  ostream *poVar4;
  size_t sVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  unsigned_long uVar14;
  char *pcVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  unsigned_long darray [4];
  unsigned_long testValue [4];
  char buf [250];
  
  uVar7 = 0xf;
  if (qlaNum == 2) {
    uVar7 = 0xf0;
  }
  uVar11 = (uint)(qlaNum == 2) * 4;
  poVar4 = std::endl<char,std::char_traits<char>>((ostream *)logFile);
  poVar4 = std::operator<<(poVar4,"=== ENCODER INPUTS ===");
  std::endl<char,std::char_traits<char>>(poVar4);
  Amp1394Console::Print
            (curLine,9,
             "This test uses the DOUT signals to generate a known number of quadrature encoder signals"
            );
  AmpIO::WriteDigitalOutput(Board,(uint8_t)uVar7,'3');
  std::operator<<((ostream *)logFile,"   Preload to 0x000000: ");
  for (iVar13 = 0; iVar13 != 4; iVar13 = iVar13 + 1) {
    AmpIO::WriteEncoderPreload(Board,uVar11 + iVar13,0);
  }
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar6 = true;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    iVar3 = AmpIO::GetEncoderPosition(Board,uVar11 | (uint)lVar9);
    darray[lVar9] = (long)iVar3;
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)logFile);
    std::operator<<(poVar4," ");
    if (iVar3 != 0) {
      bVar6 = false;
    }
  }
  if (bVar6) {
    poVar4 = std::operator<<((ostream *)logFile,"- PASS");
    std::endl<char,std::char_traits<char>>(poVar4);
    builtin_strncpy(buf,"Set encoder preload to 0 - PASS",0x20);
  }
  else {
    poVar4 = std::operator<<((ostream *)logFile,"- FAIL");
    std::endl<char,std::char_traits<char>>(poVar4);
    sprintf(buf,"Set encoder preload to 0 - FAIL (%06lx %06lx %06lx %06lx)",darray[0],darray[1],
            darray[2],darray[3]);
  }
  iVar13 = curLine + 2;
  Amp1394Console::Print(curLine + 1,9,buf);
  Amp1394Console::Refresh();
  if (bVar6) {
    poVar4 = std::operator<<((ostream *)logFile,"   Increment to 0x000100:");
    std::endl<char,std::char_traits<char>>(poVar4);
    Amp1394Console::Print(iVar13,9,"Testing encoder increment to 0x000100 -");
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      testValue[lVar9] = 0;
    }
    uVar10 = 0;
    bVar16 = false;
    while ((uVar10 < 0x40 && (bVar6))) {
      EncUp(Board,qlaNum);
      Amp1394_Sleep(0.0001);
      std::operator<<((ostream *)logFile,"      ");
      (*Port->_vptr_BasePort[0x1d])();
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        iVar3 = AmpIO::GetEncoderPosition(Board,uVar11 | (uint)lVar9);
        uVar14 = (unsigned_long)iVar3;
        darray[lVar9] = uVar14;
        std::ostream::_M_insert<unsigned_long>((ulong)logFile);
        if (testValue[lVar9] + uVar10 * 4 + 4 == uVar14) {
          std::operator<<((ostream *)logFile,"  ");
        }
        else if (uVar10 == 0) {
          std::operator<<((ostream *)logFile,"  ");
          testValue[lVar9] = uVar14 - 4;
          bVar16 = true;
        }
        else {
          std::operator<<((ostream *)logFile,"* ");
          bVar6 = false;
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)logFile);
      uVar10 = uVar10 + 1;
    }
    if (bVar6) {
      poVar4 = std::operator<<((ostream *)logFile,"   Increment result - PASS");
      std::endl<char,std::char_traits<char>>(poVar4);
      builtin_strncpy(buf,"PASS",5);
      if (bVar16) {
        sVar5 = strlen(buf);
        builtin_strncpy(buf + sVar5," (adjusted",0xb);
        pcVar15 = " 1";
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          if (testValue[lVar9] != 0x800000) {
            strcat(buf,pcVar15);
          }
          pcVar15 = pcVar15 + 3;
        }
        sVar5 = strlen(buf);
        (buf + sVar5)[0] = ')';
        (buf + sVar5)[1] = '\0';
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)logFile,"   Increment result - FAIL");
      std::endl<char,std::char_traits<char>>(poVar4);
      sprintf(buf,"FAIL at %06lx (%06lx %06lx %06lx %06lx)",(ulong)((int)uVar10 * 4 + 0x800000),
              darray[0],darray[1],darray[2],darray[3]);
    }
    Amp1394Console::Print(iVar13,0x31,buf);
    Amp1394Console::Refresh();
    iVar13 = curLine + 3;
  }
  std::operator<<((ostream *)logFile,"   Preload to 0x000100: ");
  for (iVar8 = 0; iVar8 != 4; iVar8 = iVar8 + 1) {
    AmpIO::WriteEncoderPreload(Board,uVar11 + iVar8,0x100);
  }
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar16 = true;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    iVar3 = AmpIO::GetEncoderPosition(Board,uVar11 | (uint)lVar9);
    darray[lVar9] = (long)iVar3;
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)logFile);
    std::operator<<(poVar4," ");
    if (iVar3 != 0x100) {
      bVar16 = false;
    }
  }
  if (bVar16) {
    poVar4 = std::operator<<((ostream *)logFile,"- PASS");
    std::endl<char,std::char_traits<char>>(poVar4);
    builtin_strncpy(buf + 0x20,"- PASS",7);
    builtin_strncpy(buf,"Set encoder preload to 0x000100 ",0x20);
  }
  else {
    poVar4 = std::operator<<((ostream *)logFile,"- FAIL");
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar6 = false;
    sprintf(buf,"Set encoder preload to 0x000100 - FAIL (%06lx %06lx %06lx %06lx)",darray[0],
            darray[1],darray[2],darray[3]);
  }
  iVar8 = iVar13 + 1;
  Amp1394Console::Print(iVar13,9,buf);
  Amp1394Console::Refresh();
  if (bVar16) {
    poVar4 = std::operator<<((ostream *)logFile,"   Decrement to 0x000000:");
    std::endl<char,std::char_traits<char>>(poVar4);
    Amp1394Console::Print(iVar8,9,"Testing encoder decrement to 0x000000 -");
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      testValue[lVar9] = 0;
    }
    iVar12 = 0x3f;
    bVar17 = false;
    while ((-1 < iVar12 && (bVar16))) {
      EncDown(Board,qlaNum);
      Amp1394_Sleep(0.0001);
      std::operator<<((ostream *)logFile,"      ");
      (*Port->_vptr_BasePort[0x1d])();
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        iVar3 = AmpIO::GetEncoderPosition(Board,uVar11 | (uint)lVar9);
        uVar14 = (unsigned_long)iVar3;
        darray[lVar9] = uVar14;
        *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
             *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::_M_insert<unsigned_long>((ulong)logFile);
        if (testValue[lVar9] + (ulong)(uint)(iVar12 * 4) == uVar14) {
          std::operator<<((ostream *)logFile,"  ");
        }
        else if (iVar12 == 0x3f) {
          std::operator<<((ostream *)logFile,"  ");
          testValue[lVar9] = uVar14 - 0xfc;
          bVar17 = true;
        }
        else {
          std::operator<<((ostream *)logFile,"* ");
          bVar16 = false;
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)logFile);
      iVar12 = iVar12 + -1;
    }
    if (bVar16) {
      poVar4 = std::operator<<((ostream *)logFile,"   Decrement result - PASS");
      std::endl<char,std::char_traits<char>>(poVar4);
      builtin_strncpy(buf,"PASS",5);
      if (bVar17) {
        sVar5 = strlen(buf);
        builtin_strncpy(buf + sVar5," (adjusted",0xb);
        pcVar15 = " 1";
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          if (testValue[lVar9] != 0) {
            strcat(buf,pcVar15);
          }
          pcVar15 = pcVar15 + 3;
        }
        sVar5 = strlen(buf);
        (buf + sVar5)[0] = ')';
        (buf + sVar5)[1] = '\0';
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)logFile,"   Decrement result - FAIL");
      std::endl<char,std::char_traits<char>>(poVar4);
      bVar6 = false;
      sprintf(buf,"FAIL at %06lx (%06lx %06lx %06lx %06lx)",(long)(iVar12 * 4 + 4),darray[0],
              darray[1],darray[2],darray[3]);
    }
    Amp1394Console::Print(iVar8,0x31,buf);
    Amp1394Console::Refresh();
    iVar8 = iVar13 + 2;
  }
  Amp1394Console::Print(iVar8,9,"Testing direct encoder input (A,B,I)");
  uVar1 = '\x01';
  if (qlaNum == 2) {
    uVar1 = '\x10';
  }
  AmpIO::WriteDigitalOutput(Board,uVar1,'\0');
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar2 = AmpIO::GetEncoderChannelA(Board);
  bVar16 = (bVar2 & uVar7) != 0;
  if (bVar16) {
    poVar4 = std::operator<<((ostream *)logFile,"   Setting channel A = 0, FAIL: ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)bVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar6 = false;
  }
  AmpIO::WriteDigitalOutput(Board,uVar1,uVar1);
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar2 = AmpIO::GetEncoderChannelA(Board);
  bVar17 = (uVar7 & ~(uint)bVar2) != 0;
  if (bVar17) {
    poVar4 = std::operator<<((ostream *)logFile,"   Setting channel A = 1, FAIL: ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)bVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar6 = false;
  }
  uVar1 = '\x02';
  if (qlaNum == 2) {
    uVar1 = ' ';
  }
  AmpIO::WriteDigitalOutput(Board,uVar1,'\0');
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar2 = AmpIO::GetEncoderChannelB(Board);
  bVar18 = (bVar2 & uVar7) != 0;
  if (bVar18) {
    poVar4 = std::operator<<((ostream *)logFile,"   Setting channel B = 0, FAIL: ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)bVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar6 = false;
  }
  AmpIO::WriteDigitalOutput(Board,uVar1,uVar1);
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar2 = AmpIO::GetEncoderChannelB(Board);
  bVar19 = (uVar7 & ~(uint)bVar2) != 0;
  if (bVar19) {
    poVar4 = std::operator<<((ostream *)logFile,"   Setting channel B = 1, FAIL: ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)bVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar6 = false;
  }
  uVar1 = '\x04';
  if (qlaNum == 2) {
    uVar1 = '@';
  }
  AmpIO::WriteDigitalOutput(Board,uVar1,'\0');
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar2 = AmpIO::GetEncoderIndex(Board);
  bVar20 = (bVar2 & uVar7) != 0;
  if (bVar20) {
    poVar4 = std::operator<<((ostream *)logFile,"   Setting index = 0, FAIL: ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)bVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar6 = false;
  }
  AmpIO::WriteDigitalOutput(Board,uVar1,uVar1);
  Amp1394_Sleep(0.0001);
  (*Port->_vptr_BasePort[0x1d])();
  bVar2 = AmpIO::GetEncoderIndex(Board);
  if ((uVar7 & ~(uint)bVar2) == 0) {
    pcVar15 = "- FAIL";
    if (!bVar20 && (!bVar19 && (!bVar18 && (!bVar17 && !bVar16)))) {
      pcVar15 = "- PASS";
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)logFile,"   Setting index = 1, FAIL: ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)bVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar15 = "- FAIL";
    bVar6 = false;
  }
  Amp1394Console::Print(iVar8,0x31,pcVar15);
  pcVar15 = "   Overall result: FAIL";
  if (bVar6) {
    pcVar15 = "   Overall result: PASS";
  }
  poVar4 = std::operator<<((ostream *)logFile,pcVar15);
  std::endl<char,std::char_traits<char>>(poVar4);
  return bVar6;
}

Assistant:

bool TestEncoders(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    int i, j;
    unsigned long darray[4];
    unsigned long testValue[4];
    char numStr[4][3] = { " 1", " 2", " 3", " 4" };
    char buf[250];
    bool pass = true;
    bool tmpFix;

    int encStart = (qlaNum == 2) ? 4 : 0;
    uint8_t enc_mask = (qlaNum == 2) ? 0xf0 : 0x0f;

    logFile << std::endl << "=== ENCODER INPUTS ===" << std::endl;
    Amp1394Console::Print(curLine++, 9, "This test uses the DOUT signals to"
                           " generate a known number of quadrature encoder signals");
    Board.WriteDigitalOutput(enc_mask, 0x33);
    // First, test setting of encoder preload
    logFile << "   Preload to 0x000000: ";
    for (i = 0; i < 4; i++)
        Board.WriteEncoderPreload(encStart+i, 0);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    for (i = 0; i < 4; i++) {
        darray[i] = Board.GetEncoderPosition(encStart+i);
        logFile << std::hex << darray[i] << " ";
        if (darray[i] != 0)
            pass = false;
    }
    if (pass) {
        logFile << "- PASS" << std::endl;
        sprintf(buf, "Set encoder preload to 0 - PASS");
    }
    else {
        logFile << "- FAIL" << std::endl;
        sprintf(buf, "Set encoder preload to 0 - FAIL (%06lx %06lx %06lx %06lx)",
                     darray[0], darray[1], darray[2], darray[3]);
    }
    Amp1394Console::Print(curLine++, 9, buf);
    Amp1394Console::Refresh();
    if (pass) {
        logFile << "   Increment to 0x000100:" << std::endl;
        Amp1394Console::Print(curLine, 9, "Testing encoder increment to 0x000100 -");
        tmpFix = false;
        for (j = 0; j < 4; j++)
            testValue[j] = 0;
        for (i = 0; (i < (0x100/4)) && pass; i++) {
            EncUp(Board, qlaNum);
            Amp1394_Sleep(0.0001);
            logFile << "      ";
            Port->ReadAllBoards();
            for (j = 0; j < 4; j++) {
                darray[j] = Board.GetEncoderPosition(encStart+j);
                logFile << darray[j];
                unsigned long expected = testValue[j]+4*(i+1);
                if (darray[j] != expected) {
                    // There appears to be a problem, where the count
                    // is less than expected after the preload. For now,
                    // we allow this discrepancy and adjust testValue
                    // so that we can continue the test.
                    if (i == 0) {
                        logFile << "  ";
                        testValue[j] = darray[j]-4;
                        tmpFix = true;
                    }
                    else {
                        logFile << "* ";
                        pass = false;
                    }
                }
                else
                    logFile << "  ";
            }
            logFile << std::endl;
        }
        if (pass) {
            logFile << "   Increment result - PASS" << std::endl;
            sprintf(buf, "PASS");
            if (tmpFix) {
                strcat(buf, " (adjusted");
                for (j = 0; j < 4; j++) {
                    if (testValue[j] != 0x800000)
                        strcat(buf, numStr[j]);
                }
                strcat(buf, ")");
            }
        }
        else {
            logFile << "   Increment result - FAIL" << std::endl;
            // Following message could be improved to take testValue into account.
            sprintf(buf, "FAIL at %06lx (%06lx %06lx %06lx %06lx)", 0x800000UL+4*i,
                         darray[0], darray[1], darray[2], darray[3]);
        }
        Amp1394Console::Print(curLine++, 49, buf);
        Amp1394Console::Refresh();
    }
    bool tmp_pass = true;
    logFile << "   Preload to 0x000100: ";
    for (i = 0; i < 4; i++)
        Board.WriteEncoderPreload(encStart+i, 0x000100);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    for (i = 0; i < 4; i++) {
        darray[i] = Board.GetEncoderPosition(encStart+i);
        logFile << std::hex << darray[i] << " ";
        if (darray[i] != 0x000100)
            tmp_pass = false;
    }
    if (tmp_pass) {
        logFile << "- PASS" << std::endl;
        sprintf(buf, "Set encoder preload to 0x000100 - PASS");
    }
    else {
        logFile << "- FAIL" << std::endl;
        sprintf(buf, "Set encoder preload to 0x000100 - FAIL (%06lx %06lx %06lx %06lx)",
                      darray[0], darray[1], darray[2], darray[3]);
        pass = false;
    }
    Amp1394Console::Print(curLine++, 9, buf);
    Amp1394Console::Refresh();

    if (tmp_pass) {
        logFile << "   Decrement to 0x000000:" << std::endl;
        Amp1394Console::Print(curLine, 9, "Testing encoder decrement to 0x000000 -");
        tmpFix = false;
        for (j = 0; j < 4; j++)
            testValue[j] = 0;
        for (i = (0x100/4)-1; (i >= 0) && tmp_pass; i--) {
            EncDown(Board, qlaNum);
            Amp1394_Sleep(0.0001);
            logFile << "      ";
            Port->ReadAllBoards();
            for (j = 0; j < 4; j++) {
                darray[j] = Board.GetEncoderPosition(encStart+j);
                logFile << std::hex << darray[j];
                unsigned long expected = testValue[j] + 4*i;
                if (darray[j] != expected) {
                    // There appears to be a problem, where the count
                    // is less than expected after the preload. For now,
                    // we allow this discrepancy and adjust testValue
                    // so that we can continue the test.
                    if (i == (0x100/4)-1) {
                        logFile << "  ";
                        testValue[j] = darray[j]-0x100+4;
                        tmpFix = true;
                    }
                    else {
                        logFile << "* ";
                        tmp_pass = false;
                    }
                }
                else
                    logFile << "  ";
            }
            logFile << std::endl;
        }
        if (tmp_pass) {
            logFile << "   Decrement result - PASS" << std::endl;
            sprintf(buf, "PASS");
            if (tmpFix) {
                strcat(buf, " (adjusted");
                for (j = 0; j < 4; j++) {
                    if (testValue[j] != 0)
                        strcat(buf, numStr[j]);
                }
                strcat(buf, ")");
            }
        }
        else {
            logFile << "   Decrement result - FAIL" << std::endl;
            pass = false;
            // Following message could be improved to take testValue into account.
            sprintf(buf, "FAIL at %06lx (%06lx %06lx %06lx %06lx)", 0x000000UL+4*(i+1),
                         darray[0], darray[1], darray[2], darray[3]);
        }
        Amp1394Console::Print(curLine++, 49, buf);
        Amp1394Console::Refresh();
    }

    Amp1394Console::Print(curLine, 9, "Testing direct encoder input (A,B,I)");
    bool directPass = true;

    // Test A channel directly
    uint8_t chanA;
    uint8_t dout_mask = (qlaNum == 2) ? 0x10 : 0x01;
    // Channel A low
    Board.WriteDigitalOutput(dout_mask, 0x00);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    chanA = Board.GetEncoderChannelA();
    if ((chanA&enc_mask) != 0x00) {
        logFile << "   Setting channel A = 0, FAIL: " << std::hex << (int)chanA << std::endl;
        directPass = false;
        pass = false;
    }
    // Channel A high
    Board.WriteDigitalOutput(dout_mask, dout_mask);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    chanA = Board.GetEncoderChannelA();
    if ((chanA&enc_mask) != enc_mask) {
        logFile << "   Setting channel A = 1, FAIL: " << std::hex << (int)chanA << std::endl;
        directPass = false;
        pass = false;
    }

    // Test B channel directly
    uint8_t chanB;
    dout_mask = (qlaNum == 2) ? 0x20 : 0x02;
    // Channel B low
    Board.WriteDigitalOutput(dout_mask, 0x00);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    chanB = Board.GetEncoderChannelB();
    if ((chanB&enc_mask) != 0x00) {
        logFile << "   Setting channel B = 0, FAIL: " << std::hex << (int)chanB << std::endl;
        directPass = false;
        pass = false;
    }
    // Channel B high
    Board.WriteDigitalOutput(dout_mask, dout_mask);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    chanB = Board.GetEncoderChannelB();
    if ((chanB&enc_mask) != enc_mask) {
        logFile << "   Setting channel B = 1, FAIL: " << std::hex << (int)chanB << std::endl;
        directPass = false;
        pass = false;
    }

    // Test index
    // Index low
    uint8_t index;
    dout_mask = (qlaNum == 2) ? 0x40 : 0x04;
    Board.WriteDigitalOutput(dout_mask, 0x00);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    index = Board.GetEncoderIndex();
    if ((index&enc_mask) != 0x00) {
        logFile << "   Setting index = 0, FAIL: " << std::hex << (int)index << std::endl;
        directPass = false;
        pass = false;
    }
    // Index high
    Board.WriteDigitalOutput(dout_mask, dout_mask);
    Amp1394_Sleep(0.0001);
    Port->ReadAllBoards();
    index = Board.GetEncoderIndex();
    if ((index&enc_mask) != enc_mask) {
        logFile << "   Setting index = 1, FAIL: " << std::hex << (int)index << std::endl;
        directPass = false;
        pass = false;
    }

    if (directPass)
        Amp1394Console::Print(curLine++, 49, "- PASS");
    else
        Amp1394Console::Print(curLine++, 49, "- FAIL");

    if (pass)
        logFile << "   Overall result: PASS" << std::endl;
    else
        logFile << "   Overall result: FAIL" << std::endl;
    return pass;
}